

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

string * __thiscall
helics::RandomDelayFilterOperation::getString_abi_cxx11_
          (string *__return_storage_ptr__,RandomDelayFilterOperation *this,string_view property)

{
  long lVar1;
  atomic<helics::RandomDistributions> aVar2;
  _Base_ptr p_Var3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  char *__s1;
  size_t __n;
  size_type __rlen;
  __atomic_float<double> _Var6;
  
  __s1 = property._M_str;
  __n = property._M_len;
  lVar1 = __n - 3;
  switch(lVar1) {
  case 0:
switchD_00226abf_caseD_0:
    iVar4 = bcmp(__s1,"min",__n);
    if (iVar4 != 0) {
      switch(lVar1) {
      case 0:
        goto switchD_00226af3_caseD_0;
      case 1:
        goto switchD_00226af3_caseD_1;
      case 2:
        goto switchD_00226abf_caseD_2;
      case 3:
        goto switchD_00226b8f_caseD_3;
      default:
        goto switchD_00226abf_caseD_4;
      }
    }
    goto LAB_00226c8c;
  case 1:
    iVar4 = bcmp(__s1,"dist",__n);
    if (iVar4 != 0) {
      switch(lVar1) {
      case 0:
        goto switchD_00226abf_caseD_0;
      case 1:
        goto switchD_00226b5b_caseD_1;
      case 2:
        goto switchD_00226abf_caseD_2;
      case 3:
        goto switchD_00226abf_caseD_3;
      default:
        goto switchD_00226abf_caseD_4;
      case 9:
        goto switchD_00226abf_caseD_9;
      }
    }
    goto LAB_00226cb4;
  case 2:
    break;
  case 3:
switchD_00226abf_caseD_3:
    iVar4 = bcmp(__s1,"param1",__n);
    if (iVar4 != 0) {
      switch(lVar1) {
      case 0:
        goto switchD_00226abf_caseD_0;
      case 1:
switchD_00226b5b_caseD_1:
        iVar4 = bcmp(__s1,"mean",__n);
        if (iVar4 != 0) {
          switch(lVar1) {
          case 0:
            goto switchD_00226abf_caseD_0;
          case 1:
            goto switchD_00226af3_caseD_1;
          case 2:
            goto switchD_00226abf_caseD_2;
          case 3:
            goto switchD_00226b8f_caseD_3;
          default:
            goto switchD_00226abf_caseD_4;
          }
        }
        break;
      case 2:
        goto switchD_00226abf_caseD_2;
      case 3:
        goto switchD_00226b8f_caseD_3;
      default:
        goto switchD_00226abf_caseD_4;
      }
    }
    goto LAB_00226c8c;
  default:
    goto switchD_00226abf_caseD_4;
  case 9:
switchD_00226abf_caseD_9:
    iVar4 = bcmp(__s1,"distribution",__n);
    if (iVar4 != 0) {
      switch(lVar1) {
      case 0:
        goto switchD_00226abf_caseD_0;
      case 1:
        goto switchD_00226b5b_caseD_1;
      case 2:
        goto switchD_00226abf_caseD_2;
      case 3:
        goto switchD_00226abf_caseD_3;
      default:
        goto switchD_00226abf_caseD_4;
      }
    }
LAB_00226cb4:
    aVar2._M_i = (((this->rdelayGen)._M_t.
                   super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
                   .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->dist
                 )._M_i;
    for (p_Var5 = (_Rb_tree_node_base *)distMap._24_8_;
        p_Var5 != (_Rb_tree_node_base *)(distMap + 8);
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      if (*(RandomDistributions *)&p_Var5[1]._M_left == aVar2._M_i) {
        p_Var3 = p_Var5[1]._M_parent;
        lVar1 = *(long *)(p_Var5 + 1);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,p_Var3,(long)&p_Var3->_M_color + lVar1);
        if (p_Var5 != (_Rb_tree_node_base *)(distMap + 8)) {
          return __return_storage_ptr__;
        }
        break;
      }
    }
    goto switchD_00226abf_caseD_4;
  }
switchD_00226abf_caseD_2:
  iVar4 = bcmp(__s1,"alpha",__n);
  if (iVar4 == 0) {
LAB_00226c8c:
    _Var6._M_fp = (((this->rdelayGen)._M_t.
                    super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
                    .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->
                  param1).super___atomic_float<double>._M_fp;
    goto LAB_00226c95;
  }
  if (__n == 3) {
switchD_00226af3_caseD_0:
    iVar4 = bcmp(__s1,"max",__n);
    if (iVar4 != 0) {
      if (__n != 4) goto switchD_00226abf_caseD_4;
switchD_00226af3_caseD_1:
      iVar4 = bcmp(__s1,"beta",__n);
      goto joined_r0x00226c35;
    }
  }
  else {
    if (__n == 4) goto switchD_00226af3_caseD_1;
    if (__n != 6) goto switchD_00226abf_caseD_4;
switchD_00226b8f_caseD_3:
    iVar4 = bcmp(__s1,"param2",__n);
    if (iVar4 == 0) goto LAB_00226c81;
    if (__n == 3) goto switchD_00226af3_caseD_0;
    if (__n == 4) goto switchD_00226af3_caseD_1;
    if (__n != 6) goto switchD_00226abf_caseD_4;
    iVar4 = bcmp(__s1,"stddev",6);
joined_r0x00226c35:
    if (iVar4 != 0) {
switchD_00226abf_caseD_4:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
  }
LAB_00226c81:
  _Var6._M_fp = (((this->rdelayGen)._M_t.
                  super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
                  .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->
                param2).super___atomic_float<double>._M_fp;
LAB_00226c95:
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (__return_storage_ptr__,vsnprintf,0x148,"%f",_Var6._M_fp);
  return __return_storage_ptr__;
}

Assistant:

std::string RandomDelayFilterOperation::getString(std::string_view property)
{
    if ((property == "dist") || (property == "distribution")) {
        auto currentDist = rdelayGen->dist.load();
        for (const auto& distPair : distMap) {
            if (distPair.second == currentDist) {
                return std::string(distPair.first);
            }
        }
    } else if ((property == "param1") || (property == "mean") || (property == "min") ||
               (property == "alpha")) {
        return std::to_string(rdelayGen->param1.load());
    } else if ((property == "param2") || (property == "stddev") || (property == "max") ||
               (property == "beta")) {
        return std::to_string(rdelayGen->param2.load());
    }
    return FilterOperations::getString(property);
}